

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_abs8_ppc(void *d,void *a,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    bVar3 = (char)*(byte *)((long)a + uVar2) >> 7;
    *(byte *)((long)d + uVar2) = (*(byte *)((long)a + uVar2) ^ bVar3) - bVar3;
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_abs8_ppc_cold_1();
  return;
}

Assistant:

void HELPER(gvec_abs8)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int8_t aa = *(int8_t *)((char *)a + i);
        *(int8_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}